

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasm_cpp.h
# Opt level: O3

void __thiscall
moira::Moira::dasmMove2<(moira::Instr)71,(moira::Mode)11,(moira::Size)2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  byte *pbVar3;
  uint uVar4;
  byte bVar5;
  char *pcVar6;
  char cVar7;
  
  *addr = *addr + 2;
  uVar4 = (*this->_vptr_Moira[5])();
  bVar5 = str->upper;
  pcVar6 = "move";
  if ((bool)bVar5 != false) {
    pcVar6 = "MOVE";
  }
  cVar7 = *pcVar6;
  if (cVar7 != '\0') {
    do {
      pcVar6 = pcVar6 + 1;
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = cVar7;
      cVar7 = *pcVar6;
    } while (cVar7 != '\0');
    bVar5 = str->upper;
  }
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '.';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (~bVar5 & 1) << 5 | 0x57;
  iVar1 = (this->tab).raw;
  while (pcVar6 = str->ptr, pcVar6 < str->base + iVar1) {
    str->ptr = pcVar6 + 1;
    *pcVar6 = ' ';
  }
  str->ptr = pcVar6 + 1;
  *pcVar6 = '#';
  StrWriter::operator<<(str,(UInt)(uVar4 & 0xffff));
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ',';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ' ';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = '(';
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = 'A';
  pbVar3 = (byte *)str->ptr;
  str->ptr = (char *)(pbVar3 + 1);
  *pbVar3 = (byte)(op >> 9) & 7 | 0x30;
  pcVar6 = str->ptr;
  str->ptr = pcVar6 + 1;
  *pcVar6 = ')';
  return;
}

Assistant:

void
Moira::dasmMove2(StrWriter &str, u32 &addr, u16 op)
{
    auto src = Op <M,S>       ( _____________xxx(op), addr );
    auto dst = Op <MODE_AI,S> ( ____xxx_________(op), addr );

    str << Ins<I>{} << Sz<S>{} << tab << src << ", " << dst;
}